

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

upb_Message_DeleteUnknownStatus
upb_Message_DeleteUnknown(upb_Message *msg,upb_StringView *data,uintptr_t *iter,upb_Arena *arena)

{
  char *pcVar1;
  char *pcVar2;
  uintptr_t uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  _Bool _Var7;
  ulong uVar8;
  ulong uVar9;
  long *plVar10;
  ulong uVar11;
  ulong *puVar12;
  upb_Message_DeleteUnknownStatus uVar13;
  uint *puVar14;
  
  puVar14 = (uint *)(msg->field_0).internal_opaque;
  if (((ulong)puVar14 & 1) != 0) {
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                  ,0xb0,
                  "upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message *, upb_StringView *, uintptr_t *, upb_Arena *)"
                 );
  }
  uVar9 = *iter;
  if (uVar9 == 0) {
    __assert_fail("*iter != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                  ,0xb1,
                  "upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message *, upb_StringView *, uintptr_t *, upb_Arena *)"
                 );
  }
  if (puVar14 == (uint *)0x0) {
    __assert_fail("in",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                  ,0xb3,
                  "upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message *, upb_StringView *, uintptr_t *, upb_Arena *)"
                 );
  }
  if (*puVar14 < uVar9) {
    __assert_fail("*iter <= in->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                  ,0xb4,
                  "upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message *, upb_StringView *, uintptr_t *, upb_Arena *)"
                 );
  }
  uVar8 = *(ulong *)(puVar14 + uVar9 * 2);
  if ((uVar8 == 0) || ((uVar8 & 1) != 0)) {
    __assert_fail("upb_TaggedAuxPtr_IsUnknown(unknown_ptr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                  ,0xb6,
                  "upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message *, upb_StringView *, uintptr_t *, upb_Arena *)"
                 );
  }
  puVar12 = (ulong *)(uVar8 & 0xfffffffffffffffc);
  pcVar1 = (char *)*puVar12;
  pcVar2 = data->data;
  if (pcVar1 == pcVar2) {
    if (puVar12[1] == data->size) {
      (puVar14 + uVar9 * 2)[0] = 0;
      (puVar14 + uVar9 * 2)[1] = 0;
      goto LAB_00295e79;
    }
    if (pcVar1 == pcVar2) {
      sVar4 = data->size;
      *puVar12 = (ulong)(pcVar1 + sVar4);
      puVar12[1] = puVar12[1] - sVar4;
      uVar9 = puVar12[1];
      data->data = (char *)*puVar12;
      data->size = uVar9;
      return kUpb_DeleteUnknown_IterUpdated;
    }
  }
  if (pcVar1 + puVar12[1] == pcVar2 + data->size) {
    puVar12[1] = puVar12[1] - data->size;
    if ((uVar8 & 2) == 0) {
      *(ulong *)(puVar14 + *iter * 2) = uVar8 | 2;
    }
  }
  else {
    if ((pcVar2 <= pcVar1) || (pcVar1 + puVar12[1] <= pcVar2 + data->size)) {
      __assert_fail("unknown->data < data->data && unknown->data + unknown->size > data->data + data->size"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/message.c"
                    ,0xca,
                    "upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message *, upb_StringView *, uintptr_t *, upb_Arena *)"
                   );
    }
    plVar10 = (long *)arena->ptr_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)arena->end_dont_copy_me__upb_internal_use_only - (long)plVar10) < 0x10) {
      plVar10 = (long *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(arena,0x10);
    }
    else {
      if ((long *)((long)plVar10 + 7U & 0xfffffffffffffff8) != plVar10) {
        __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                      ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
      }
      arena->ptr_dont_copy_me__upb_internal_use_only = (char *)(plVar10 + 2);
    }
    if (plVar10 == (long *)0x0) {
      return kUpb_DeleteUnknown_AllocFail;
    }
    _Var7 = _upb_Message_ReserveSlot_dont_copy_me__upb_internal_use_only(msg,arena);
    if (!_Var7) {
      return kUpb_DeleteUnknown_AllocFail;
    }
    puVar14 = (uint *)((msg->field_0).internal_opaque & 0xfffffffffffffffe);
    uVar3 = *iter;
    if (*puVar14 - uVar3 != 0) {
      memmove(puVar14 + uVar3 * 2 + 4,puVar14 + uVar3 * 2 + 2,(*puVar14 - uVar3) * 8);
    }
    *(ulong *)(puVar14 + *iter * 2 + 2) = (ulong)plVar10 | 2;
    if ((uVar8 & 2) == 0) {
      *(ulong *)(puVar14 + *iter * 2) = uVar8 | 2;
    }
    *puVar14 = *puVar14 + 1;
    pcVar1 = data->data;
    sVar4 = data->size;
    *plVar10 = (long)(pcVar1 + sVar4);
    uVar9 = *puVar12;
    plVar10[1] = (puVar12[1] + uVar9) - (long)(pcVar1 + sVar4);
    puVar12[1] = (long)data->data - uVar9;
  }
LAB_00295e79:
  uVar9 = *iter;
  puVar14 = (uint *)((msg->field_0).internal_opaque & 0xfffffffffffffffe);
  if (puVar14 == (uint *)0x0) {
LAB_00295ec6:
    data->data = (char *)0x0;
    data->size = 0;
    uVar13 = kUpb_DeleteUnknown_DeletedLast;
  }
  else {
    uVar11 = (ulong)*puVar14;
    uVar8 = uVar9;
    uVar6 = uVar11;
    if (uVar11 < uVar9) {
      uVar6 = uVar9;
    }
    do {
      uVar9 = uVar6;
      if (uVar11 <= uVar8) goto LAB_00295ec6;
      uVar5 = *(ulong *)(puVar14 + uVar8 * 2 + 2);
      uVar8 = uVar8 + 1;
      uVar6 = uVar9;
    } while ((uVar5 & 1) != 0 || uVar5 == 0);
    sVar4 = ((undefined8 *)(uVar5 & 0xfffffffffffffffc))[1];
    data->data = *(char **)(uVar5 & 0xfffffffffffffffc);
    data->size = sVar4;
    uVar13 = kUpb_DeleteUnknown_IterUpdated;
    uVar9 = uVar8;
  }
  *iter = uVar9;
  return uVar13;
}

Assistant:

upb_Message_DeleteUnknownStatus upb_Message_DeleteUnknown(upb_Message* msg,
                                                          upb_StringView* data,
                                                          uintptr_t* iter,
                                                          upb_Arena* arena) {
  UPB_ASSERT(!upb_Message_IsFrozen(msg));
  UPB_ASSERT(*iter != kUpb_Message_UnknownBegin);
  upb_Message_Internal* in = UPB_PRIVATE(_upb_Message_GetInternal)(msg);
  UPB_ASSERT(in);
  UPB_ASSERT(*iter <= in->size);
  upb_TaggedAuxPtr unknown_ptr = in->aux_data[*iter - 1];
  UPB_ASSERT(upb_TaggedAuxPtr_IsUnknown(unknown_ptr));
  upb_StringView* unknown = upb_TaggedAuxPtr_UnknownData(unknown_ptr);
  if (unknown->data == data->data && unknown->size == data->size) {
    // Remove whole field
    in->aux_data[*iter - 1] = upb_TaggedAuxPtr_Null();
  } else if (unknown->data == data->data) {
    // Strip prefix
    unknown->data += data->size;
    unknown->size -= data->size;
    *data = *unknown;
    return kUpb_DeleteUnknown_IterUpdated;
  } else if (unknown->data + unknown->size == data->data + data->size) {
    // Truncate existing field
    unknown->size -= data->size;
    if (!upb_TaggedAuxPtr_IsUnknownAliased(unknown_ptr)) {
      in->aux_data[*iter - 1] =
          upb_TaggedAuxPtr_MakeUnknownDataAliased(unknown);
    }
  } else {
    UPB_ASSERT(unknown->data < data->data &&
               unknown->data + unknown->size > data->data + data->size);
    // Split in the middle
    upb_StringView* prefix = unknown;
    upb_StringView* suffix = upb_Arena_Malloc(arena, sizeof(upb_StringView));
    if (!suffix) {
      return kUpb_DeleteUnknown_AllocFail;
    }
    if (!UPB_PRIVATE(_upb_Message_ReserveSlot)(msg, arena)) {
      return kUpb_DeleteUnknown_AllocFail;
    }
    in = UPB_PRIVATE(_upb_Message_GetInternal)(msg);
    if (*iter != in->size) {
      // Shift later entries down so that unknown field ordering is preserved
      memmove(&in->aux_data[*iter + 1], &in->aux_data[*iter],
              sizeof(upb_TaggedAuxPtr) * (in->size - *iter));
    }
    in->aux_data[*iter] = upb_TaggedAuxPtr_MakeUnknownDataAliased(suffix);
    if (!upb_TaggedAuxPtr_IsUnknownAliased(unknown_ptr)) {
      in->aux_data[*iter - 1] = upb_TaggedAuxPtr_MakeUnknownDataAliased(prefix);
    }
    in->size++;
    suffix->data = data->data + data->size;
    suffix->size = (prefix->data + prefix->size) - suffix->data;
    prefix->size = data->data - prefix->data;
  }
  return upb_Message_NextUnknown(msg, data, iter)
             ? kUpb_DeleteUnknown_IterUpdated
             : kUpb_DeleteUnknown_DeletedLast;
}